

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_fop_FF(DisasContext_conflict8 *dc,int rd,int rs,
               _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_i32_conflict *gen)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 v;
  
  tcg_ctx = dc->uc->tcg_ctx;
  pTVar1 = gen_load_fpr_F(dc,rs);
  v = get_temp_i32(dc);
  (*gen)(tcg_ctx,v,tcg_ctx->cpu_env,pTVar1);
  gen_helper_check_ieee_exceptions(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_fsr,tcg_ctx->cpu_env);
  gen_store_fpr_F(dc,rd,v);
  return;
}

Assistant:

static inline void gen_fop_FF(DisasContext *dc, int rd, int rs,
                              void (*gen)(TCGContext *, TCGv_i32, TCGv_ptr, TCGv_i32))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i32 dst, src;

    src = gen_load_fpr_F(dc, rs);
    dst = gen_dest_fpr_F(dc);

    gen(tcg_ctx, dst, tcg_ctx->cpu_env, src);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_store_fpr_F(dc, rd, dst);
}